

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

void __thiscall
ON_SubD_FixedSizeHeap::Internal_HashAddPair
          (ON_SubD_FixedSizeHeap *this,uint hash,ON_SubDComponentPtr component0,
          ON_SubDVertex *vertex1)

{
  ON_SubD_FixedSizeHeap_ComponentPairHashElement *pOVar1;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement **ppOVar2;
  uint uVar3;
  ON_SubDComponentPtr OVar4;
  
  if ((this->m_h_count != 0xffffffff) && (this->m_h_capacity != 0)) {
    uVar3 = (vertex1->super_ON_SubDComponentBase).m_id;
    if (uVar3 != this->m_v_index) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
                 ,0x18c,"","unexpected has table state");
      return;
    }
    pOVar1 = this->m_hash_elements;
    uVar3 = uVar3 - 1;
    pOVar1[uVar3].m_pair.m_pair[0].m_ptr = component0.m_ptr;
    OVar4 = ON_SubDComponentPtr::Create(vertex1);
    pOVar1[uVar3].m_pair.m_pair[1].m_ptr = OVar4.m_ptr;
    ppOVar2 = this->m_hash_table;
    pOVar1[uVar3].m_next = ppOVar2[hash];
    ppOVar2[hash] = pOVar1 + uVar3;
    this->m_h_count = this->m_h_count + 1;
  }
  return;
}

Assistant:

bool ON_SubD_FixedSizeHeap::Internal_HashEnabled() const
{
  return (ON_SubD_FixedSizeHeap::DisabledHashCount != m_h_count && m_h_capacity > 0);
}